

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.cpp
# Opt level: O1

Builder * embree::avx::BVH4QuantizedTriangle4iSceneBuilderSAH(void *bvh,Scene *scene,size_t mode)

{
  long lVar1;
  _func_int **pp_Var2;
  Builder *pBVar3;
  __int_type_conflict _Var4;
  
  pBVar3 = (Builder *)operator_new(0xa0);
  (pBVar3->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pBVar3->super_RefCount)._vptr_RefCount = (_func_int **)&PTR__BVHNBuilderSAHQuantized_02212e48;
  pBVar3[1].super_RefCount._vptr_RefCount = (_func_int **)bvh;
  pBVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)scene;
  pBVar3[2].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  lVar1 = *(long *)&(scene->super_AccelN).field_0x188;
  _Var4 = lVar1 + 0x550;
  if (lVar1 == 0) {
    _Var4 = 0;
  }
  pBVar3[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = _Var4;
  *(undefined1 *)&pBVar3[3].super_RefCount._vptr_RefCount = 0;
  pBVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar3[3].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar3[4].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar3[5].super_RefCount._vptr_RefCount = (_func_int **)0x2;
  pBVar3[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0x20;
  for (pp_Var2 = (_func_int **)0x3f; 4UL >> (long)pp_Var2 == 0;
      pp_Var2 = (_func_int **)((long)pp_Var2 + -1)) {
  }
  pBVar3[6].super_RefCount._vptr_RefCount = pp_Var2;
  pBVar3[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 4;
  pBVar3[7].super_RefCount._vptr_RefCount = (_func_int **)0x1c;
  pBVar3[7].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)&DAT_3f8000003f800000;
  pBVar3[8].super_RefCount._vptr_RefCount = (_func_int **)0x400;
  pBVar3[8].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0xffffffffffffffff;
  pBVar3[9].super_RefCount._vptr_RefCount = (_func_int **)0x100000;
  pBVar3[9].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0xffffffff;
  return pBVar3;
}

Assistant:

Builder* BVH4QuantizedTriangle4iSceneBuilderSAH (void* bvh, Scene* scene, size_t mode) { return new BVHNBuilderSAHQuantized<4,Triangle4i>((BVH4*)bvh,scene,4,1.0f,4,inf,TriangleMesh::geom_type); }